

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableModel::removeItem(QTableModel *this,QTableWidgetItem *item)

{
  int iVar1;
  qsizetype qVar2;
  pointer ppQVar3;
  int iVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QTableWidgetItem *local_38;
  QTableWidgetItem *item_local;
  QTableWidgetItem **local_28;
  
  local_28 = *(QTableWidgetItem ***)(in_FS_OFFSET + 0x28);
  item_local = item;
  qVar2 = QtPrivate::indexOf<QTableWidgetItem*,QTableWidgetItem*>(&this->tableItems,&item_local,0);
  if ((int)qVar2 == -1) {
    qVar2 = QtPrivate::indexOf<QTableWidgetItem*,QTableWidgetItem*>
                      (&this->verticalHeaderItems,&item_local,0);
    iVar4 = (int)qVar2;
    if (iVar4 == -1) {
      qVar2 = QtPrivate::indexOf<QTableWidgetItem*,QTableWidgetItem*>
                        (&this->horizontalHeaderItems,&item_local,0);
      iVar4 = (int)qVar2;
      if (iVar4 == -1) goto LAB_005353d6;
      ppQVar3 = QList<QTableWidgetItem_*>::data(&this->horizontalHeaderItems);
      ppQVar3[iVar4] = (QTableWidgetItem *)0x0;
      iVar1 = 1;
    }
    else {
      ppQVar3 = QList<QTableWidgetItem_*>::data(&this->verticalHeaderItems);
      ppQVar3[iVar4] = (QTableWidgetItem *)0x0;
      iVar1 = 2;
    }
    QAbstractItemModel::headerDataChanged((Orientation)this,iVar1,iVar4);
  }
  else {
    local_38 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    index((QTableModel *)&local_48,(char *)this,(int)item_local);
    ppQVar3 = QList<QTableWidgetItem_*>::data(&this->tableItems);
    ppQVar3[(int)qVar2] = (QTableWidgetItem *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (int *)0x0;
    local_68.size = 0;
    QAbstractItemModel::dataChanged
              ((QModelIndex *)this,(QModelIndex *)&local_48,(QList_conflict *)&local_48);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_68);
  }
LAB_005353d6:
  if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::removeItem(QTableWidgetItem *item)
{
    int i = tableItems.indexOf(item);
    if (i != -1) {
        QModelIndex idx = index(item);
        tableItems[i] = nullptr;
        emit dataChanged(idx, idx);
        return;
    }

    i = verticalHeaderItems.indexOf(item);

    if (i != -1) {
        verticalHeaderItems[i] = 0;
        emit headerDataChanged(Qt::Vertical, i, i);
        return;
    }
    i = horizontalHeaderItems.indexOf(item);
    if (i != -1) {
        horizontalHeaderItems[i] = 0;
        emit headerDataChanged(Qt::Horizontal, i, i);
        return;
    }
}